

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrerequisiteTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::ReadPixelsCase::iterate(ReadPixelsCase *this)

{
  RenderContext *context;
  TestContext *this_00;
  TestLog *this_01;
  ReadPixelsCase *pRVar1;
  bool bVar2;
  deUint32 dVar3;
  int iVar4;
  uint height;
  deUint32 dVar5;
  deUint32 dVar6;
  GLenum err;
  RGBA threshold;
  RenderTarget *pRVar7;
  size_t __n;
  Surface *pSVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  uint uVar9;
  int iVar10;
  byte bVar11;
  int i;
  int iVar12;
  uint local_3ac;
  allocator<char> local_3a8;
  allocator<char> local_3a7;
  allocator<char> local_3a6;
  allocator<char> local_3a5;
  allocator<char> local_3a4;
  allocator<char> local_3a3;
  allocator<char> local_3a2;
  allocator<char> local_3a1;
  undefined8 local_3a0;
  ReadPixelsCase *local_398;
  deRandom rnd;
  Surface refImage;
  Surface resImage;
  Surface diffImage;
  PixelFormat pixelFormat;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  LogImageSet local_220;
  LogImage local_1e0;
  LogImage local_150;
  LogImage local_c0;
  
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  pixelFormat.redBits = (pRVar7->m_pixelFormat).redBits;
  pixelFormat.greenBits = (pRVar7->m_pixelFormat).greenBits;
  pixelFormat.blueBits = (pRVar7->m_pixelFormat).blueBits;
  pixelFormat.alphaBits = (pRVar7->m_pixelFormat).alphaBits;
  iVar4 = pRVar7->m_width;
  height = pRVar7->m_height;
  dVar3 = ::deInt32Hash(this->m_curIter);
  deRandom_init(&rnd,dVar3);
  iVar10 = this->m_curIter;
  local_398 = this;
  if (iVar10 == 0) {
    local_3a0 = (ulong)local_3a0._4_4_ << 0x20;
    local_3ac = 0;
  }
  else if (iVar10 == 2) {
    local_3ac = iVar4 / 2;
    iVar4 = iVar4 - local_3ac;
    local_3a0 = CONCAT44(local_3a0._4_4_,(int)height / 2);
    height = height - (int)height / 2;
  }
  else if (iVar10 == 1) {
    iVar4 = iVar4 / 2;
    height = (int)height / 2;
    local_3a0 = local_3a0 & 0xffffffff00000000;
    local_3ac = 0;
  }
  else {
    dVar3 = deRandom_getUint32(&rnd);
    local_3ac = dVar3 % (iVar4 - 1U);
    dVar3 = deRandom_getUint32(&rnd);
    uVar9 = dVar3 % (height - 1);
    dVar3 = deRandom_getUint32(&rnd);
    iVar4 = dVar3 % (~local_3ac + iVar4) + 1;
    dVar3 = deRandom_getUint32(&rnd);
    local_3a0 = CONCAT44(local_3a0._4_4_,uVar9);
    height = dVar3 % (~uVar9 + height) + 1;
  }
  tcu::Surface::Surface(&resImage,iVar4,height);
  tcu::Surface::Surface(&refImage,iVar4,height);
  tcu::Surface::Surface(&diffImage,iVar4,height);
  dVar3 = deRandom_getUint32(&rnd);
  dVar5 = deRandom_getUint32(&rnd);
  dVar6 = deRandom_getUint32(&rnd);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1e0,&refImage);
  local_150.m_name._M_string_length._4_4_ = 0xff;
  local_150.m_name._M_dataplus._M_p._0_4_ = dVar3 & 0xff;
  local_150.m_name._M_dataplus._M_p._4_4_ = dVar5 & 0xff;
  local_150.m_name._M_string_length._0_4_ = dVar6 & 0xff;
  tcu::clear((PixelBufferAccess *)&local_1e0,(IVec4 *)&local_150);
  glwClearColor((float)(dVar3 & 0xff) / 255.0,(float)(dVar5 & 0xff) / 255.0,
                (float)(dVar6 & 0xff) / 255.0,1.0);
  glwClear(0x4000);
  context = ((local_398->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1e0,&resImage);
  glu::readPixels(context,local_3ac,(int)local_3a0,(PixelBufferAccess *)&local_1e0);
  err = glwGetError();
  __n = 0xe8;
  glu::checkError(err,"glReadPixels() failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrerequisiteTests.cpp"
                  ,0xe8);
  threshold = tcu::PixelFormat::getColorThreshold(&pixelFormat);
  iVar10 = 0;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  local_3a0 = (ulong)height;
  if ((int)height < 1) {
    local_3a0 = 0;
  }
  bVar11 = 1;
  for (; pRVar1 = local_398, iVar10 != (int)local_3a0; iVar10 = iVar10 + 1) {
    for (iVar12 = 0; iVar4 != iVar12; iVar12 = iVar12 + 1) {
      bVar2 = tcu::compareThreshold
                        ((RGBA)*(deUint32 *)
                                ((long)refImage.m_pixels.m_ptr +
                                (long)(refImage.m_width * iVar10 + iVar12) * 4),
                         (RGBA)*(deUint32 *)
                                ((long)resImage.m_pixels.m_ptr +
                                (long)(resImage.m_width * iVar10 + iVar12) * 4),threshold);
      __n = 0xff0000ff;
      if (bVar2) {
        __n = 0xff00ff00;
      }
      *(int *)((long)diffImage.m_pixels.m_ptr + (long)(diffImage.m_width * iVar10 + iVar12) * 4) =
           (int)__n;
      bVar11 = bVar11 & bVar2;
    }
  }
  this_00 = (local_398->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if (bVar11 == 0) {
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,"Fail");
    this_01 = ((pRVar1->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"Result",&local_3a1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Resulting framebuffer",&local_3a2);
    tcu::LogImageSet::LogImageSet(&local_220,&local_240,&local_260);
    iVar4 = (int)this_01;
    tcu::LogImageSet::write(&local_220,iVar4,__buf,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"Result",&local_3a3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Resulting framebuffer",&local_3a4);
    pSVar8 = &resImage;
    tcu::LogImage::LogImage(&local_1e0,&local_280,&local_2a0,pSVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_1e0,iVar4,__buf_00,(size_t)pSVar8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,"Reference",&local_3a5);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"Reference image",&local_3a6);
    pSVar8 = &refImage;
    tcu::LogImage::LogImage(&local_150,&local_2c0,&local_2e0,pSVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_150,iVar4,__buf_01,(size_t)pSVar8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"DiffMask",&local_3a7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"Failing pixels",&local_3a8);
    pSVar8 = &diffImage;
    tcu::LogImage::LogImage(&local_c0,&local_300,&local_320,pSVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_c0,iVar4,__buf_02,(size_t)pSVar8);
    tcu::TestLog::endImageSet(this_01);
    tcu::LogImage::~LogImage(&local_c0);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
    tcu::LogImage::~LogImage(&local_150);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
    tcu::LogImage::~LogImage(&local_1e0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
    tcu::LogImageSet::~LogImageSet(&local_220);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&local_240);
  }
  else {
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
  }
  iVar10 = pRVar1->m_curIter + 1;
  pRVar1->m_curIter = iVar10;
  iVar4 = pRVar1->m_numIters;
  tcu::Surface::~Surface(&diffImage);
  tcu::Surface::~Surface(&refImage);
  tcu::Surface::~Surface(&resImage);
  return (uint)(iVar10 < iVar4);
}

Assistant:

TestCase::IterateResult ReadPixelsCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	tcu::PixelFormat			pixelFormat		= renderTarget.getPixelFormat();
	int							targetWidth		= renderTarget.getWidth();
	int							targetHeight	= renderTarget.getHeight();
	int							x				= 0;
	int							y				= 0;
	int							imageWidth		= 0;
	int							imageHeight		= 0;

	deRandom rnd;
	deRandom_init(&rnd, deInt32Hash(m_curIter));

	switch (m_curIter)
	{
		case 0:
			// Fullscreen
			x = 0;
			y = 0;
			imageWidth  = targetWidth;
			imageHeight = targetHeight;
			break;
		case 1:
			// Upper left corner
			x = 0;
			y = 0;
			imageWidth = targetWidth / 2;
			imageHeight = targetHeight / 2;
			break;
		case 2:
			// Lower right corner
			x = targetWidth / 2;
			y = targetHeight / 2;
			imageWidth = targetWidth - x;
			imageHeight = targetHeight - y;
			break;
		default:
			x = deRandom_getUint32(&rnd) % (targetWidth - 1);
			y = deRandom_getUint32(&rnd) % (targetHeight - 1);
			imageWidth = 1 + (deRandom_getUint32(&rnd) % (targetWidth - x - 1));
			imageHeight = 1 + (deRandom_getUint32(&rnd) % (targetHeight - y - 1));
			break;
	}

	Surface	resImage(imageWidth, imageHeight);
	Surface	refImage(imageWidth, imageHeight);
	Surface	diffImage(imageWidth, imageHeight);

	int r = (int)(deRandom_getUint32(&rnd) & 0xFF);
	int g = (int)(deRandom_getUint32(&rnd) & 0xFF);
	int b = (int)(deRandom_getUint32(&rnd) & 0xFF);

	tcu::clear(refImage.getAccess(), tcu::IVec4(r, g, b, 255));
	glClearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, 1.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	glu::readPixels(m_context.getRenderContext(), x, y, resImage.getAccess());
	GLU_CHECK_MSG("glReadPixels() failed.");

	RGBA colorThreshold = pixelFormat.getColorThreshold();
	RGBA matchColor(0, 255, 0, 255);
	RGBA diffColor(255, 0, 0, 255);
	bool isImageOk = true;

	for (int j = 0; j < imageHeight; j++)
	{
		for (int i = 0; i < imageWidth; i++)
		{
			RGBA		resRGBA		= resImage.getPixel(i, j);
			RGBA		refRGBA		= refImage.getPixel(i, j);
			bool		isPixelOk	= compareThreshold(refRGBA, resRGBA, colorThreshold);
			diffImage.setPixel(i, j, isPixelOk ? matchColor : diffColor);

			isImageOk = isImageOk && isPixelOk;
		}
	}

	if (isImageOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Resulting framebuffer")
						   << TestLog::Image("Result",		"Resulting framebuffer",	resImage)
						   << TestLog::Image("Reference",	"Reference image",			refImage)
						   << TestLog::Image("DiffMask",	"Failing pixels",			diffImage)
						   << TestLog::EndImageSet;
	}

	return (++m_curIter < m_numIters) ? CONTINUE : STOP;
}